

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_pow op;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z_1;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_2;
  v4si emm0;
  int local_27b4;
  undefined8 *local_27a0;
  undefined1 (*local_2790) [32];
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  undefined4 uStack_2604;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [8];
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2380 [8];
  float fStack_2378;
  float fStack_2374;
  float fStack_2370;
  float fStack_236c;
  float fStack_2368;
  float fStack_2364;
  undefined1 local_2300 [8];
  float fStack_22f8;
  float fStack_22f4;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined1 local_2280 [8];
  float fStack_2278;
  float fStack_2274;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  float local_2260;
  float fStack_225c;
  float fStack_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  float fStack_2248;
  float fStack_2244;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  float local_2200;
  float fStack_21fc;
  float fStack_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  float fStack_21e8;
  float fStack_21e4;
  float local_21c0;
  float fStack_21bc;
  float fStack_21b8;
  float fStack_21b4;
  float fStack_21b0;
  float fStack_21ac;
  float fStack_21a8;
  float fStack_21a4;
  float local_1ec0;
  float fStack_1ebc;
  float fStack_1eb8;
  float fStack_1eb4;
  float fStack_1eb0;
  float fStack_1eac;
  float fStack_1ea8;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c30;
  undefined8 uStack_c28;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a60;
  undefined8 uStack_a58;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  
  local_27b4 = 0;
  fVar1 = *in_RSI;
  auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
  auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
  local_27a0 = in_RDX;
  local_2790 = in_RDI;
  for (; local_27b4 + 7 < in_ECX * in_R8D; local_27b4 = local_27b4 + 8) {
    auVar2 = vcmpps_avx(*local_2790,ZEXT1632(ZEXT816(0)),2);
    auVar7._8_8_ = 0x80000000800000;
    auVar7._0_8_ = 0x80000000800000;
    auVar7._16_8_ = 0x80000000800000;
    auVar7._24_8_ = 0x80000000800000;
    auVar6 = vmaxps_avx(*local_2790,auVar7);
    auVar8 = vpsrld_avx(auVar6._0_16_,ZEXT416(0x17));
    auVar9 = vpsrld_avx(auVar6._16_16_,ZEXT416(0x17));
    auVar13._8_8_ = 0x807fffff807fffff;
    auVar13._0_8_ = 0x807fffff807fffff;
    auVar13._16_8_ = 0x807fffff807fffff;
    auVar13._24_8_ = 0x807fffff807fffff;
    auVar6 = vandps_avx(auVar6,auVar13);
    auVar21._8_8_ = 0x3f0000003f000000;
    auVar21._0_8_ = 0x3f0000003f000000;
    auVar21._16_8_ = 0x3f0000003f000000;
    auVar21._24_8_ = 0x3f0000003f000000;
    auVar7 = vorps_avx(auVar6,auVar21);
    auVar24._8_8_ = 0x7f0000007f;
    auVar24._0_8_ = 0x7f0000007f;
    auVar8 = vpsubd_avx(auVar8,auVar24);
    auVar23._8_8_ = 0x7f0000007f;
    auVar23._0_8_ = 0x7f0000007f;
    auVar9 = vpsubd_avx(auVar9,auVar23);
    local_de0 = auVar9._0_8_;
    uStack_dd8 = auVar9._8_8_;
    auVar22._16_8_ = local_de0;
    auVar22._0_16_ = auVar8;
    auVar22._24_8_ = uStack_dd8;
    auVar6 = vcvtdq2ps_avx(auVar22);
    local_21c0 = auVar6._0_4_;
    fStack_21bc = auVar6._4_4_;
    fStack_21b8 = auVar6._8_4_;
    fStack_21b4 = auVar6._12_4_;
    fStack_21b0 = auVar6._16_4_;
    fStack_21ac = auVar6._20_4_;
    fStack_21a8 = auVar6._24_4_;
    fStack_21a4 = auVar6._28_4_;
    local_2300._4_4_ = fStack_21bc + 1.0;
    local_2300._0_4_ = local_21c0 + 1.0;
    fStack_22f8 = fStack_21b8 + 1.0;
    fStack_22f4 = fStack_21b4 + 1.0;
    uStack_22f0._0_4_ = fStack_21b0 + 1.0;
    uStack_22f0._4_4_ = fStack_21ac + 1.0;
    uStack_22e8._0_4_ = fStack_21a8 + 1.0;
    uStack_22e8._4_4_ = fStack_21a4 + 1.0;
    auVar10 = _local_2300;
    auVar3 = vcmpps_avx(auVar7,_DAT_01f8f6e0,1);
    auVar6 = vandps_avx(auVar7,auVar3);
    auVar11._8_8_ = 0x3f8000003f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._16_8_ = 0x3f8000003f800000;
    auVar11._24_8_ = 0x3f8000003f800000;
    auVar7 = vsubps_avx(auVar7,auVar11);
    uStack_22e8 = auVar10._24_8_;
    auVar12._8_8_ = 0x3f8000003f800000;
    auVar12._0_8_ = 0x3f8000003f800000;
    auVar12._16_8_ = 0x3f8000003f800000;
    auVar12._24_8_ = 0x3f8000003f800000;
    auVar3 = vandps_avx(auVar12,auVar3);
    auVar10._16_8_ = uStack_22f0;
    auVar10._0_16_ = _local_2300;
    auVar10._24_8_ = uStack_22e8;
    auVar3 = vsubps_avx(auVar10,auVar3);
    local_2200 = auVar7._0_4_;
    fStack_21fc = auVar7._4_4_;
    fStack_21f8 = auVar7._8_4_;
    fStack_21f4 = auVar7._12_4_;
    fStack_21f0 = auVar7._16_4_;
    fStack_21ec = auVar7._20_4_;
    fStack_21e8 = auVar7._24_4_;
    fStack_21e4 = auVar7._28_4_;
    local_2220 = auVar6._0_4_;
    fStack_221c = auVar6._4_4_;
    fStack_2218 = auVar6._8_4_;
    fStack_2214 = auVar6._12_4_;
    fStack_2210 = auVar6._16_4_;
    fStack_220c = auVar6._20_4_;
    fStack_2208 = auVar6._24_4_;
    fStack_2204 = auVar6._28_4_;
    local_2200 = local_2200 + local_2220;
    fStack_21fc = fStack_21fc + fStack_221c;
    fStack_21f8 = fStack_21f8 + fStack_2218;
    fStack_21f4 = fStack_21f4 + fStack_2214;
    fStack_21f0 = fStack_21f0 + fStack_2210;
    fStack_21ec = fStack_21ec + fStack_220c;
    fStack_21e8 = fStack_21e8 + fStack_2208;
    fStack_21e4 = fStack_21e4 + fStack_2204;
    local_1ec0 = auVar3._0_4_;
    fStack_1ebc = auVar3._4_4_;
    fStack_1eb8 = auVar3._8_4_;
    fStack_1eb4 = auVar3._12_4_;
    fStack_1eb0 = auVar3._16_4_;
    fStack_1eac = auVar3._20_4_;
    fStack_1ea8 = auVar3._24_4_;
    local_2380._4_4_ =
         fStack_1ebc * -0.00021219444 +
         ((((((((fStack_21fc * 0.070376836 + -0.1151461) * fStack_21fc + 0.116769984) * fStack_21fc
              + -0.12420141) * fStack_21fc + 0.14249323) * fStack_21fc + -0.16668057) * fStack_21fc
           + 0.20000714) * fStack_21fc + -0.24999994) * fStack_21fc + 0.3333333) * fStack_21fc *
         fStack_21fc * fStack_21fc;
    local_2380._0_4_ =
         local_1ec0 * -0.00021219444 +
         ((((((((local_2200 * 0.070376836 + -0.1151461) * local_2200 + 0.116769984) * local_2200 +
              -0.12420141) * local_2200 + 0.14249323) * local_2200 + -0.16668057) * local_2200 +
           0.20000714) * local_2200 + -0.24999994) * local_2200 + 0.3333333) * local_2200 *
         local_2200 * local_2200;
    fStack_2378 = fStack_1eb8 * -0.00021219444 +
                  ((((((((fStack_21f8 * 0.070376836 + -0.1151461) * fStack_21f8 + 0.116769984) *
                        fStack_21f8 + -0.12420141) * fStack_21f8 + 0.14249323) * fStack_21f8 +
                     -0.16668057) * fStack_21f8 + 0.20000714) * fStack_21f8 + -0.24999994) *
                   fStack_21f8 + 0.3333333) * fStack_21f8 * fStack_21f8 * fStack_21f8;
    fStack_2374 = fStack_1eb4 * -0.00021219444 +
                  ((((((((fStack_21f4 * 0.070376836 + -0.1151461) * fStack_21f4 + 0.116769984) *
                        fStack_21f4 + -0.12420141) * fStack_21f4 + 0.14249323) * fStack_21f4 +
                     -0.16668057) * fStack_21f4 + 0.20000714) * fStack_21f4 + -0.24999994) *
                   fStack_21f4 + 0.3333333) * fStack_21f4 * fStack_21f4 * fStack_21f4;
    fStack_2370 = fStack_1eb0 * -0.00021219444 +
                  ((((((((fStack_21f0 * 0.070376836 + -0.1151461) * fStack_21f0 + 0.116769984) *
                        fStack_21f0 + -0.12420141) * fStack_21f0 + 0.14249323) * fStack_21f0 +
                     -0.16668057) * fStack_21f0 + 0.20000714) * fStack_21f0 + -0.24999994) *
                   fStack_21f0 + 0.3333333) * fStack_21f0 * fStack_21f0 * fStack_21f0;
    fStack_236c = fStack_1eac * -0.00021219444 +
                  ((((((((fStack_21ec * 0.070376836 + -0.1151461) * fStack_21ec + 0.116769984) *
                        fStack_21ec + -0.12420141) * fStack_21ec + 0.14249323) * fStack_21ec +
                     -0.16668057) * fStack_21ec + 0.20000714) * fStack_21ec + -0.24999994) *
                   fStack_21ec + 0.3333333) * fStack_21ec * fStack_21ec * fStack_21ec;
    fStack_2368 = fStack_1ea8 * -0.00021219444 +
                  ((((((((fStack_21e8 * 0.070376836 + -0.1151461) * fStack_21e8 + 0.116769984) *
                        fStack_21e8 + -0.12420141) * fStack_21e8 + 0.14249323) * fStack_21e8 +
                     -0.16668057) * fStack_21e8 + 0.20000714) * fStack_21e8 + -0.24999994) *
                   fStack_21e8 + 0.3333333) * fStack_21e8 * fStack_21e8 * fStack_21e8;
    fStack_2364 = fStack_21e4 + 0.3333333 + -0.00021219444;
    auVar15._4_4_ = fStack_21fc * fStack_21fc * 0.5;
    auVar15._0_4_ = local_2200 * local_2200 * 0.5;
    auVar15._8_4_ = fStack_21f8 * fStack_21f8 * 0.5;
    auVar15._12_4_ = fStack_21f4 * fStack_21f4 * 0.5;
    auVar15._16_4_ = fStack_21f0 * fStack_21f0 * 0.5;
    auVar15._20_4_ = fStack_21ec * fStack_21ec * 0.5;
    auVar15._24_4_ = fStack_21e8 * fStack_21e8 * 0.5;
    auVar15._28_4_ = fStack_21e4;
    auVar6 = vsubps_avx(_local_2380,auVar15);
    local_2260 = auVar6._0_4_;
    fStack_225c = auVar6._4_4_;
    fStack_2258 = auVar6._8_4_;
    fStack_2254 = auVar6._12_4_;
    fStack_2250 = auVar6._16_4_;
    fStack_224c = auVar6._20_4_;
    fStack_2248 = auVar6._24_4_;
    fStack_2244 = auVar6._28_4_;
    local_2280._4_4_ = fStack_1ebc * 0.6933594 + fStack_21fc + fStack_225c;
    local_2280._0_4_ = local_1ec0 * 0.6933594 + local_2200 + local_2260;
    fStack_2278 = fStack_1eb8 * 0.6933594 + fStack_21f8 + fStack_2258;
    fStack_2274 = fStack_1eb4 * 0.6933594 + fStack_21f4 + fStack_2254;
    uStack_2270._0_4_ = fStack_1eb0 * 0.6933594 + fStack_21f0 + fStack_2250;
    uStack_2270._4_4_ = fStack_1eac * 0.6933594 + fStack_21ec + fStack_224c;
    uStack_2268._0_4_ = fStack_1ea8 * 0.6933594 + fStack_21e8 + fStack_2248;
    uStack_2268._4_4_ = fStack_21e4 + fStack_2244 + 0.6933594;
    auVar6 = _local_2280;
    uStack_2268 = auVar6._24_8_;
    auVar20._16_8_ = uStack_2270;
    auVar20._0_16_ = _local_2280;
    auVar20._24_8_ = uStack_2268;
    auVar6 = vorps_avx(auVar20,auVar2);
    local_2620 = auVar5._0_4_;
    fStack_261c = auVar5._4_4_;
    fStack_2618 = auVar5._8_4_;
    fStack_2614 = auVar5._12_4_;
    fStack_2610 = auVar4._0_4_;
    fStack_260c = auVar4._4_4_;
    fStack_2608 = auVar4._8_4_;
    uStack_2604 = auVar4._12_4_;
    local_2640 = auVar6._0_4_;
    fStack_263c = auVar6._4_4_;
    fStack_2638 = auVar6._8_4_;
    fStack_2634 = auVar6._12_4_;
    fStack_2630 = auVar6._16_4_;
    fStack_262c = auVar6._20_4_;
    fStack_2628 = auVar6._24_4_;
    local_2520._4_4_ = fStack_261c * fStack_263c;
    local_2520._0_4_ = local_2620 * local_2640;
    fStack_2518 = fStack_2618 * fStack_2638;
    fStack_2514 = fStack_2614 * fStack_2634;
    uStack_2510._0_4_ = fStack_2610 * fStack_2630;
    uStack_2510._4_4_ = fStack_260c * fStack_262c;
    uStack_2508._0_4_ = fStack_2608 * fStack_2628;
    uStack_2508._4_4_ = uStack_2604;
    auVar6 = _local_2520;
    uStack_2508 = auVar6._24_8_;
    auVar2._16_8_ = uStack_2510;
    auVar2._0_16_ = _local_2520;
    auVar2._24_8_ = uStack_2508;
    auVar6._8_8_ = 0x42b0c0a542b0c0a5;
    auVar6._0_8_ = 0x42b0c0a542b0c0a5;
    auVar6._16_8_ = 0x42b0c0a542b0c0a5;
    auVar6._24_8_ = 0x42b0c0a542b0c0a5;
    auVar6 = vminps_avx(auVar2,auVar6);
    auVar3._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._16_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._24_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3 = vmaxps_avx(auVar6,auVar3);
    local_1560 = auVar3._0_4_;
    fStack_155c = auVar3._4_4_;
    fStack_1558 = auVar3._8_4_;
    fStack_1554 = auVar3._12_4_;
    fStack_1550 = auVar3._16_4_;
    fStack_154c = auVar3._20_4_;
    fStack_1548 = auVar3._24_4_;
    local_2560._4_4_ = fStack_155c * 1.442695 + 0.5;
    local_2560._0_4_ = local_1560 * 1.442695 + 0.5;
    fStack_2558 = fStack_1558 * 1.442695 + 0.5;
    fStack_2554 = fStack_1554 * 1.442695 + 0.5;
    fStack_2550 = fStack_1550 * 1.442695 + 0.5;
    fStack_254c = fStack_154c * 1.442695 + 0.5;
    fStack_2548 = fStack_1548 * 1.442695 + 0.5;
    uStack_2544 = 0x3ff8aa3b;
    auVar2 = vroundps_avx(_local_2560,1);
    auVar6 = vcmpps_avx(_local_2560,auVar2,1);
    auVar14._8_8_ = 0x3f8000003f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._16_8_ = 0x3f8000003f800000;
    auVar14._24_8_ = 0x3f8000003f800000;
    auVar6 = vandps_avx(auVar6,auVar14);
    auVar6 = vsubps_avx(auVar2,auVar6);
    local_1280 = auVar6._0_4_;
    fStack_127c = auVar6._4_4_;
    fStack_1278 = auVar6._8_4_;
    fStack_1274 = auVar6._12_4_;
    fStack_1270 = auVar6._16_4_;
    fStack_126c = auVar6._20_4_;
    fStack_1268 = auVar6._24_4_;
    fStack_1264 = auVar6._28_4_;
    auVar17._4_4_ = fStack_127c * 0.6933594;
    auVar17._0_4_ = local_1280 * 0.6933594;
    auVar17._8_4_ = fStack_1278 * 0.6933594;
    auVar17._12_4_ = fStack_1274 * 0.6933594;
    auVar17._16_4_ = fStack_1270 * 0.6933594;
    auVar17._20_4_ = fStack_126c * 0.6933594;
    auVar17._24_4_ = fStack_1268 * 0.6933594;
    auVar17._28_4_ = fStack_1264;
    auVar6 = vsubps_avx(auVar3,auVar17);
    auVar16._4_4_ = fStack_127c * -0.00021219444;
    auVar16._0_4_ = local_1280 * -0.00021219444;
    auVar16._8_4_ = fStack_1278 * -0.00021219444;
    auVar16._12_4_ = fStack_1274 * -0.00021219444;
    auVar16._16_4_ = fStack_1270 * -0.00021219444;
    auVar16._20_4_ = fStack_126c * -0.00021219444;
    auVar16._24_4_ = fStack_1268 * -0.00021219444;
    auVar16._28_4_ = fStack_1264;
    auVar6 = vsubps_avx(auVar6,auVar16);
    local_2420 = auVar6._0_4_;
    fStack_241c = auVar6._4_4_;
    fStack_2418 = auVar6._8_4_;
    fStack_2414 = auVar6._12_4_;
    fStack_2410 = auVar6._16_4_;
    fStack_240c = auVar6._20_4_;
    fStack_2408 = auVar6._24_4_;
    fStack_2404 = auVar6._28_4_;
    local_2580 = CONCAT44((int)fStack_127c,(int)local_1280);
    uStack_2578 = CONCAT44((int)fStack_1274,(int)fStack_1278);
    uStack_2570 = CONCAT44((int)fStack_126c,(int)fStack_1270);
    uStack_2568 = CONCAT44((int)fStack_1264,(int)fStack_1268);
    auVar19._8_8_ = uStack_2578;
    auVar19._0_8_ = local_2580;
    auVar8._8_8_ = 0x7f0000007f;
    auVar8._0_8_ = 0x7f0000007f;
    auVar8 = vpaddd_avx(auVar19,auVar8);
    auVar18._8_8_ = uStack_2568;
    auVar18._0_8_ = uStack_2570;
    auVar9._8_8_ = 0x7f0000007f;
    auVar9._0_8_ = 0x7f0000007f;
    auVar9 = vpaddd_avx(auVar18,auVar9);
    auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
    auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
    local_2480 = auVar8._0_4_;
    fStack_247c = auVar8._4_4_;
    fStack_2478 = auVar8._8_4_;
    fStack_2474 = auVar8._12_4_;
    fStack_2470 = auVar9._0_4_;
    fStack_246c = auVar9._4_4_;
    fStack_2468 = auVar9._8_4_;
    local_25e0 = CONCAT44(((((((fStack_241c * 0.00019875691 + 0.0013981999) * fStack_241c +
                              0.008333452) * fStack_241c + 0.041665796) * fStack_241c + 0.16666666)
                            * fStack_241c + 0.5) * fStack_241c * fStack_241c + fStack_241c + 1.0) *
                          fStack_247c,
                          ((((((local_2420 * 0.00019875691 + 0.0013981999) * local_2420 +
                              0.008333452) * local_2420 + 0.041665796) * local_2420 + 0.16666666) *
                            local_2420 + 0.5) * local_2420 * local_2420 + local_2420 + 1.0) *
                          local_2480);
    uStack_25d8 = CONCAT44(((((((fStack_2414 * 0.00019875691 + 0.0013981999) * fStack_2414 +
                               0.008333452) * fStack_2414 + 0.041665796) * fStack_2414 + 0.16666666)
                             * fStack_2414 + 0.5) * fStack_2414 * fStack_2414 + fStack_2414 + 1.0) *
                           fStack_2474,
                           ((((((fStack_2418 * 0.00019875691 + 0.0013981999) * fStack_2418 +
                               0.008333452) * fStack_2418 + 0.041665796) * fStack_2418 + 0.16666666)
                             * fStack_2418 + 0.5) * fStack_2418 * fStack_2418 + fStack_2418 + 1.0) *
                           fStack_2478);
    uStack_25d0 = CONCAT44(((((((fStack_240c * 0.00019875691 + 0.0013981999) * fStack_240c +
                               0.008333452) * fStack_240c + 0.041665796) * fStack_240c + 0.16666666)
                             * fStack_240c + 0.5) * fStack_240c * fStack_240c + fStack_240c + 1.0) *
                           fStack_246c,
                           ((((((fStack_2410 * 0.00019875691 + 0.0013981999) * fStack_2410 +
                               0.008333452) * fStack_2410 + 0.041665796) * fStack_2410 + 0.16666666)
                             * fStack_2410 + 0.5) * fStack_2410 * fStack_2410 + fStack_2410 + 1.0) *
                           fStack_2470);
    uStack_25c8 = CONCAT44(fStack_2404 + fStack_2404 + 1.0,
                           ((((((fStack_2408 * 0.00019875691 + 0.0013981999) * fStack_2408 +
                               0.008333452) * fStack_2408 + 0.041665796) * fStack_2408 + 0.16666666)
                             * fStack_2408 + 0.5) * fStack_2408 * fStack_2408 + fStack_2408 + 1.0) *
                           fStack_2468);
    *local_27a0 = local_25e0;
    local_27a0[1] = uStack_25d8;
    local_27a0[2] = uStack_25d0;
    local_27a0[3] = uStack_25c8;
    local_2790 = local_2790 + 1;
    local_27a0 = local_27a0 + 4;
  }
  fVar1 = *in_RSI;
  for (; local_27b4 + 3 < in_ECX * in_R8D; local_27b4 = local_27b4 + 4) {
    auVar4 = vcmpps_avx(*(undefined1 (*) [16])*local_2790,ZEXT816(0),2);
    auVar30._8_8_ = 0x80000000800000;
    auVar30._0_8_ = 0x80000000800000;
    auVar5 = vmaxps_avx(*(undefined1 (*) [16])*local_2790,auVar30);
    auVar8 = vpsrld_avx(auVar5,ZEXT416(0x17));
    auVar35._8_8_ = 0x807fffff807fffff;
    auVar35._0_8_ = 0x807fffff807fffff;
    auVar5 = vpand_avx(auVar5,auVar35);
    auVar41._8_8_ = 0x3f0000003f000000;
    auVar41._0_8_ = 0x3f0000003f000000;
    auVar9 = vpor_avx(auVar5,auVar41);
    auVar31._8_8_ = 0x7f0000007f;
    auVar31._0_8_ = 0x7f0000007f;
    auVar5 = vpsubd_avx(auVar8,auVar31);
    auVar5 = vcvtdq2ps_avx(auVar5);
    local_a00 = auVar5._0_4_;
    fStack_9fc = auVar5._4_4_;
    fStack_9f8 = auVar5._8_4_;
    fStack_9f4 = auVar5._12_4_;
    local_aa0 = CONCAT44(fStack_9fc + 1.0,local_a00 + 1.0);
    uStack_a98._0_4_ = fStack_9f8 + 1.0;
    uStack_a98._4_4_ = fStack_9f4 + 1.0;
    auVar42._8_8_ = 0x3f3504f33f3504f3;
    auVar42._0_8_ = 0x3f3504f33f3504f3;
    auVar5 = vcmpps_avx(auVar9,auVar42,1);
    auVar8 = vpand_avx(auVar9,auVar5);
    auVar29._8_8_ = 0x3f8000003f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar9 = vsubps_avx(auVar9,auVar29);
    auVar34._8_8_ = 0x3f8000003f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    auVar5 = vpand_avx(auVar34,auVar5);
    auVar28._8_8_ = uStack_a98;
    auVar28._0_8_ = local_aa0;
    auVar5 = vsubps_avx(auVar28,auVar5);
    local_a20 = auVar9._0_4_;
    fStack_a1c = auVar9._4_4_;
    fStack_a18 = auVar9._8_4_;
    fStack_a14 = auVar9._12_4_;
    local_a30 = auVar8._0_4_;
    fStack_a2c = auVar8._4_4_;
    fStack_a28 = auVar8._8_4_;
    fStack_a24 = auVar8._12_4_;
    local_a20 = local_a20 + local_a30;
    fStack_a1c = fStack_a1c + fStack_a2c;
    fStack_a18 = fStack_a18 + fStack_a28;
    fStack_a14 = fStack_a14 + fStack_a24;
    local_620 = auVar5._0_4_;
    fStack_61c = auVar5._4_4_;
    fStack_618 = auVar5._8_4_;
    fStack_614 = auVar5._12_4_;
    local_ae0._4_4_ =
         fStack_61c * -0.00021219444 +
         ((((((((fStack_a1c * 0.070376836 + -0.1151461) * fStack_a1c + 0.116769984) * fStack_a1c +
              -0.12420141) * fStack_a1c + 0.14249323) * fStack_a1c + -0.16668057) * fStack_a1c +
           0.20000714) * fStack_a1c + -0.24999994) * fStack_a1c + 0.3333333) * fStack_a1c *
         fStack_a1c * fStack_a1c;
    local_ae0._0_4_ =
         local_620 * -0.00021219444 +
         ((((((((local_a20 * 0.070376836 + -0.1151461) * local_a20 + 0.116769984) * local_a20 +
              -0.12420141) * local_a20 + 0.14249323) * local_a20 + -0.16668057) * local_a20 +
           0.20000714) * local_a20 + -0.24999994) * local_a20 + 0.3333333) * local_a20 *
         local_a20 * local_a20;
    fStack_ad8 = fStack_618 * -0.00021219444 +
                 ((((((((fStack_a18 * 0.070376836 + -0.1151461) * fStack_a18 + 0.116769984) *
                       fStack_a18 + -0.12420141) * fStack_a18 + 0.14249323) * fStack_a18 +
                    -0.16668057) * fStack_a18 + 0.20000714) * fStack_a18 + -0.24999994) * fStack_a18
                 + 0.3333333) * fStack_a18 * fStack_a18 * fStack_a18;
    fStack_ad4 = fStack_614 * -0.00021219444 +
                 ((((((((fStack_a14 * 0.070376836 + -0.1151461) * fStack_a14 + 0.116769984) *
                       fStack_a14 + -0.12420141) * fStack_a14 + 0.14249323) * fStack_a14 +
                    -0.16668057) * fStack_a14 + 0.20000714) * fStack_a14 + -0.24999994) * fStack_a14
                 + 0.3333333) * fStack_a14 * fStack_a14 * fStack_a14;
    auVar37._4_4_ = fStack_a1c * fStack_a1c * 0.5;
    auVar37._0_4_ = local_a20 * local_a20 * 0.5;
    auVar37._8_4_ = fStack_a18 * fStack_a18 * 0.5;
    auVar37._12_4_ = fStack_a14 * fStack_a14 * 0.5;
    auVar5 = vsubps_avx(_local_ae0,auVar37);
    local_a50 = auVar5._0_4_;
    fStack_a4c = auVar5._4_4_;
    fStack_a48 = auVar5._8_4_;
    fStack_a44 = auVar5._12_4_;
    local_a60 = CONCAT44(fStack_61c * 0.6933594 + fStack_a1c + fStack_a4c,
                         local_620 * 0.6933594 + local_a20 + local_a50);
    uStack_a58._0_4_ = fStack_618 * 0.6933594 + fStack_a18 + fStack_a48;
    uStack_a58._4_4_ = fStack_614 * 0.6933594 + fStack_a14 + fStack_a44;
    auVar40._8_8_ = uStack_a58;
    auVar40._0_8_ = local_a60;
    auVar4 = vpor_avx(auVar40,auVar4);
    local_cc0 = auVar4._0_4_;
    fStack_cbc = auVar4._4_4_;
    fStack_cb8 = auVar4._8_4_;
    fStack_cb4 = auVar4._12_4_;
    local_c30 = CONCAT44(fVar1 * fStack_cbc,fVar1 * local_cc0);
    uStack_c28._0_4_ = fVar1 * fStack_cb8;
    uStack_c28._4_4_ = fVar1 * fStack_cb4;
    auVar25._8_8_ = uStack_c28;
    auVar25._0_8_ = local_c30;
    auVar4._8_8_ = 0x42b0c0a542b0c0a5;
    auVar4._0_8_ = 0x42b0c0a542b0c0a5;
    auVar4 = vminps_avx(auVar25,auVar4);
    auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar8 = vmaxps_avx(auVar4,auVar5);
    local_b70 = auVar8._0_4_;
    fStack_b6c = auVar8._4_4_;
    fStack_b68 = auVar8._8_4_;
    fStack_b64 = auVar8._12_4_;
    fVar43 = local_b70 * 1.442695 + 0.5;
    fVar44 = fStack_b6c * 1.442695 + 0.5;
    fVar45 = fStack_b68 * 1.442695 + 0.5;
    fVar46 = fStack_b64 * 1.442695 + 0.5;
    local_c50 = CONCAT44(fVar44,fVar43);
    uStack_c48._0_4_ = fVar45;
    uStack_c48._4_4_ = fVar46;
    local_c60 = CONCAT44((int)fVar44,(int)fVar43);
    uStack_c58._0_4_ = (int)fVar45;
    uStack_c58._4_4_ = (int)fVar46;
    auVar32._8_8_ = uStack_c58;
    auVar32._0_8_ = local_c60;
    auVar5 = vcvtdq2ps_avx(auVar32);
    auVar33._8_8_ = uStack_c48;
    auVar33._0_8_ = local_c50;
    auVar4 = vcmpps_avx(auVar33,auVar5,1);
    auVar36._8_8_ = 0x3f8000003f800000;
    auVar36._0_8_ = 0x3f8000003f800000;
    auVar4 = vpand_avx(auVar4,auVar36);
    auVar4 = vsubps_avx(auVar5,auVar4);
    local_6e0 = auVar4._0_4_;
    fStack_6dc = auVar4._4_4_;
    fStack_6d8 = auVar4._8_4_;
    fStack_6d4 = auVar4._12_4_;
    auVar39._4_4_ = fStack_6dc * 0.6933594;
    auVar39._0_4_ = local_6e0 * 0.6933594;
    auVar39._8_4_ = fStack_6d8 * 0.6933594;
    auVar39._12_4_ = fStack_6d4 * 0.6933594;
    auVar4 = vsubps_avx(auVar8,auVar39);
    auVar38._4_4_ = fStack_6dc * -0.00021219444;
    auVar38._0_4_ = local_6e0 * -0.00021219444;
    auVar38._8_4_ = fStack_6d8 * -0.00021219444;
    auVar38._12_4_ = fStack_6d4 * -0.00021219444;
    auVar4 = vsubps_avx(auVar4,auVar38);
    local_b90 = auVar4._0_4_;
    fStack_b8c = auVar4._4_4_;
    fStack_b88 = auVar4._8_4_;
    fStack_b84 = auVar4._12_4_;
    local_c60 = CONCAT44((int)fStack_6dc,(int)local_6e0);
    uStack_c58._0_4_ = (int)fStack_6d8;
    uStack_c58._4_4_ = (int)fStack_6d4;
    auVar27._8_8_ = uStack_c58;
    auVar27._0_8_ = local_c60;
    auVar26._8_8_ = 0x7f0000007f;
    auVar26._0_8_ = 0x7f0000007f;
    auVar4 = vpaddd_avx(auVar27,auVar26);
    auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
    local_bc0 = auVar4._0_4_;
    fStack_bbc = auVar4._4_4_;
    fStack_bb8 = auVar4._8_4_;
    fStack_bb4 = auVar4._12_4_;
    local_c90 = CONCAT44(((((((fStack_b8c * 0.00019875691 + 0.0013981999) * fStack_b8c + 0.008333452
                             ) * fStack_b8c + 0.041665796) * fStack_b8c + 0.16666666) * fStack_b8c +
                          0.5) * fStack_b8c * fStack_b8c + fStack_b8c + 1.0) * fStack_bbc,
                         ((((((local_b90 * 0.00019875691 + 0.0013981999) * local_b90 + 0.008333452)
                             * local_b90 + 0.041665796) * local_b90 + 0.16666666) * local_b90 + 0.5)
                          * local_b90 * local_b90 + local_b90 + 1.0) * local_bc0);
    uStack_c88 = CONCAT44(((((((fStack_b84 * 0.00019875691 + 0.0013981999) * fStack_b84 +
                              0.008333452) * fStack_b84 + 0.041665796) * fStack_b84 + 0.16666666) *
                            fStack_b84 + 0.5) * fStack_b84 * fStack_b84 + fStack_b84 + 1.0) *
                          fStack_bb4,
                          ((((((fStack_b88 * 0.00019875691 + 0.0013981999) * fStack_b88 +
                              0.008333452) * fStack_b88 + 0.041665796) * fStack_b88 + 0.16666666) *
                            fStack_b88 + 0.5) * fStack_b88 * fStack_b88 + fStack_b88 + 1.0) *
                          fStack_bb8);
    *local_27a0 = local_c90;
    local_27a0[1] = uStack_c88;
    local_2790 = (undefined1 (*) [32])(*local_2790 + 0x10);
    local_27a0 = local_27a0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}